

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O2

void iDynTree::XMLParser::XMLParserPimpl::parserCallbackEndDocument(void *context)

{
  char cVar1;
  long lVar2;
  
  lVar2 = *context;
  if (*(char *)(lVar2 + 0x1a1) == '\x01') {
    iDynTree::reportInfo("XMLParser","parserCallbackEndDocument","End document");
    lVar2 = *context;
  }
  cVar1 = (**(code **)(**(long **)(lVar2 + 0x170) + 0x18))();
  if (cVar1 == '\0') {
    iDynTree::reportError
              ("XMLParser","parserCallbackEndDocument","Document final callback failed processing");
  }
  lVar2 = *context;
  if (*(long *)(lVar2 + 0x130) != *(long *)(lVar2 + 0x110)) {
    std::__shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x170));
    iDynTree::reportError("XMLParser","parserCallbackEndDocument","Unbalanced tags in the document")
    ;
    return;
  }
  return;
}

Assistant:

void XMLParser::XMLParserPimpl::parserCallbackEndDocument(void* context)
    {
        XMLParser *state = static_cast<XMLParser*>(context);
        if (state->m_pimpl->m_logParsing) {
            reportInfo("XMLParser", "parserCallbackEndDocument", "End document");
        }

        if (!state->m_pimpl->m_document->documentHasBeenParsed()) {
            reportError("XMLParser", "parserCallbackEndDocument", "Document final callback failed processing");
        }
        
        if (!state->m_pimpl->m_parsedTrace.empty()) {
            // This is an error. Reset the document as it is invalid
            state->m_pimpl->m_document.reset();
            reportError("XMLParser", "parserCallbackEndDocument", "Unbalanced tags in the document");
        }
        
    }